

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_global_motion(AV1_COMP *cpi,aom_write_bit_buffer *wb)

{
  WarpedMotionParams *ref_params_00;
  WarpedMotionParams *in_RSI;
  long in_RDI;
  WarpedMotionParams *ref_params;
  int frame;
  AV1_COMMON *cm;
  int iStackY_2c;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  ref_params_00 = (WarpedMotionParams *)(in_RDI + 0x3bf80);
  for (iVar1 = 1; iVar1 < 8; iVar1 = iVar1 + 1) {
    if (*(long *)(ref_params_00[6].wmmat + 2) == 0) {
      iStackY_2c = 0;
    }
    else {
      iStackY_2c = (int)((ulong)(*(long *)(ref_params_00[6].wmmat + 2) + 0x114 + (long)iVar1 * 0x24)
                        >> 0x20);
    }
    write_global_motion_params
              (in_RSI,ref_params_00,
               (aom_write_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),iStackY_2c);
  }
  return;
}

Assistant:

static inline void write_global_motion(AV1_COMP *cpi,
                                       struct aom_write_bit_buffer *wb) {
  AV1_COMMON *const cm = &cpi->common;
  int frame;
  for (frame = LAST_FRAME; frame <= ALTREF_FRAME; ++frame) {
    const WarpedMotionParams *ref_params =
        cm->prev_frame ? &cm->prev_frame->global_motion[frame]
                       : &default_warp_params;
    write_global_motion_params(&cm->global_motion[frame], ref_params, wb,
                               cm->features.allow_high_precision_mv);
    // TODO(sarahparker, debargha): The logic in the commented out code below
    // does not work currently and causes mismatches when resize is on.
    // Fix it before turning the optimization back on.
    /*
    YV12_BUFFER_CONFIG *ref_buf = get_ref_frame_yv12_buf(cpi, frame);
    if (cpi->source->y_crop_width == ref_buf->y_crop_width &&
        cpi->source->y_crop_height == ref_buf->y_crop_height) {
      write_global_motion_params(&cm->global_motion[frame],
                                 &cm->prev_frame->global_motion[frame], wb,
                                 cm->features.allow_high_precision_mv);
    } else {
      assert(cm->global_motion[frame].wmtype == IDENTITY &&
             "Invalid warp type for frames of different resolutions");
    }
    */
    /*
    printf("Frame %d/%d: Enc Ref %d: %d %d %d %d\n",
           cm->current_frame.frame_number, cm->show_frame, frame,
           cm->global_motion[frame].wmmat[0],
           cm->global_motion[frame].wmmat[1], cm->global_motion[frame].wmmat[2],
           cm->global_motion[frame].wmmat[3]);
           */
  }
}